

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O0

void __thiscall
MemoryEditor::DrawPreviewData
          (MemoryEditor *this,size_t addr,ImU8 *mem_data,size_t mem_size,ImGuiDataType data_type,
          DataFormat data_format,char *out_buf,size_t out_buf_size)

{
  ImU8 IVar1;
  char *pcVar2;
  size_t local_98;
  undefined8 local_88;
  double float64;
  undefined8 uStack_78;
  float float32;
  uint64_t uint64;
  int64_t int64;
  uint32_t uint32;
  int32_t int32;
  uint8_t local_58 [2];
  uint16_t uint16;
  int16_t int16;
  uint8_t uint8;
  int8_t int8;
  uint8_t binbuf [8];
  int n;
  int i;
  size_t size;
  size_t elem_size;
  uint8_t buf [8];
  DataFormat data_format_local;
  ImGuiDataType data_type_local;
  size_t mem_size_local;
  ImU8 *mem_data_local;
  size_t addr_local;
  MemoryEditor *this_local;
  
  buf._0_4_ = data_format;
  buf._4_4_ = data_type;
  local_98 = DataTypeGetSize(this,data_type);
  if (mem_size < addr + local_98) {
    local_98 = mem_size - addr;
  }
  if (this->ReadFn == (_func_ImU8_ImU8_ptr_size_t_void_ptr *)0x0) {
    memcpy(&elem_size,mem_data + addr,local_98);
  }
  else {
    binbuf[4] = '\0';
    binbuf[5] = '\0';
    binbuf[6] = '\0';
    binbuf[7] = '\0';
    binbuf._0_4_ = (int)local_98;
    for (; (int)binbuf._4_4_ < (int)binbuf._0_4_; binbuf._4_4_ = binbuf._4_4_ + 1) {
      IVar1 = (*this->ReadFn)(mem_data,addr + (long)(int)binbuf._4_4_,this->FnUserData);
      buf[(long)(int)binbuf._4_4_ + -8] = IVar1;
    }
  }
  if (buf._0_4_ == 0) {
    EndianessCopy(this,local_58,&elem_size,local_98);
    pcVar2 = FormatBinary(this,local_58,(int)local_98 << 3);
    snprintf(out_buf,out_buf_size,"%s",pcVar2);
  }
  else {
    *out_buf = '\0';
    switch(buf._4_4_) {
    case 0:
      int32._3_1_ = 0;
      EndianessCopy(this,(void *)((long)&int32 + 3),&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%hhd",(ulong)(uint)(int)(char)int32._3_1_);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"0x%02x",(ulong)int32._3_1_);
      }
      break;
    case 1:
      int32._2_1_ = 0;
      EndianessCopy(this,(void *)((long)&int32 + 2),&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%hhu",(ulong)int32._2_1_);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"0x%02x",(ulong)int32._2_1_);
      }
      break;
    case 2:
      int32._0_2_ = 0;
      EndianessCopy(this,&int32,&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%hd",(ulong)(uint)(int)(short)(ushort)int32);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"0x%04x",(ulong)(ushort)int32);
      }
      break;
    case 3:
      uint32._2_2_ = 0;
      EndianessCopy(this,(void *)((long)&uint32 + 2),&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%hu",(ulong)uint32._2_2_);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"0x%04x",(ulong)uint32._2_2_);
      }
      break;
    case 4:
      int64._4_4_ = 0;
      EndianessCopy(this,(void *)((long)&int64 + 4),&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%d",(ulong)int64._4_4_);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"0x%08x",(ulong)int64._4_4_);
      }
      break;
    case 5:
      int64._0_4_ = 0;
      EndianessCopy(this,&int64,&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%u",(ulong)(uint)int64);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"0x%08x",(ulong)(uint)int64);
      }
      break;
    case 6:
      uint64 = 0;
      EndianessCopy(this,&uint64,&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%lld",uint64);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"0x%016llx",uint64);
      }
      break;
    case 7:
      uStack_78 = 0;
      EndianessCopy(this,&stack0xffffffffffffff88,&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%llu",uStack_78);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"0x%016llx",uStack_78);
      }
      break;
    case 8:
      float64._4_4_ = 0.0;
      EndianessCopy(this,(void *)((long)&float64 + 4),&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%f",(double)float64._4_4_);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"%a",(double)float64._4_4_);
      }
      break;
    case 9:
      local_88 = 0;
      EndianessCopy(this,&local_88,&elem_size,local_98);
      if (buf._0_4_ == 1) {
        snprintf(out_buf,out_buf_size,"%f",local_88);
      }
      else {
        if (buf._0_4_ != 2) goto switchD_002060c8_default;
        snprintf(out_buf,out_buf_size,"%a",local_88);
      }
      break;
    case 10:
    default:
switchD_002060c8_default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui_memory_editor/imgui_memory_editor.h"
                    ,0x2e9,
                    "void MemoryEditor::DrawPreviewData(size_t, const ImU8 *, size_t, ImGuiDataType, DataFormat, char *, size_t) const"
                   );
    }
  }
  return;
}

Assistant:

void DrawPreviewData(size_t addr, const ImU8* mem_data, size_t mem_size, ImGuiDataType data_type, DataFormat data_format, char* out_buf, size_t out_buf_size) const
    {
        uint8_t buf[8];
        size_t elem_size = DataTypeGetSize(data_type);
        size_t size = addr + elem_size > mem_size ? mem_size - addr : elem_size;
        if (ReadFn)
            for (int i = 0, n = (int)size; i < n; ++i)
                buf[i] = ReadFn(mem_data, addr + i, FnUserData);
        else
            memcpy(buf, mem_data + addr, size);

        if (data_format == DataFormat_Bin)
        {
            uint8_t binbuf[8];
            EndianessCopy(binbuf, buf, size);
            ImSnprintf(out_buf, out_buf_size, "%s", FormatBinary(binbuf, (int)size * 8));
            return;
        }

        out_buf[0] = 0;
        switch (data_type)
        {
        case ImGuiDataType_S8:
        {
            int8_t int8 = 0;
            EndianessCopy(&int8, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%hhd", int8); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%02x", int8 & 0xFF); return; }
            break;
        }
        case ImGuiDataType_U8:
        {
            uint8_t uint8 = 0;
            EndianessCopy(&uint8, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%hhu", uint8); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%02x", uint8 & 0XFF); return; }
            break;
        }
        case ImGuiDataType_S16:
        {
            int16_t int16 = 0;
            EndianessCopy(&int16, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%hd", int16); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%04x", int16 & 0xFFFF); return; }
            break;
        }
        case ImGuiDataType_U16:
        {
            uint16_t uint16 = 0;
            EndianessCopy(&uint16, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%hu", uint16); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%04x", uint16 & 0xFFFF); return; }
            break;
        }
        case ImGuiDataType_S32:
        {
            int32_t int32 = 0;
            EndianessCopy(&int32, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%d", int32); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%08x", int32); return; }
            break;
        }
        case ImGuiDataType_U32:
        {
            uint32_t uint32 = 0;
            EndianessCopy(&uint32, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%u", uint32); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%08x", uint32); return; }
            break;
        }
        case ImGuiDataType_S64:
        {
            int64_t int64 = 0;
            EndianessCopy(&int64, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%lld", (long long)int64); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%016llx", (long long)int64); return; }
            break;
        }
        case ImGuiDataType_U64:
        {
            uint64_t uint64 = 0;
            EndianessCopy(&uint64, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%llu", (long long)uint64); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "0x%016llx", (long long)uint64); return; }
            break;
        }
        case ImGuiDataType_Float:
        {
            float float32 = 0.0f;
            EndianessCopy(&float32, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%f", float32); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "%a", float32); return; }
            break;
        }
        case ImGuiDataType_Double:
        {
            double float64 = 0.0;
            EndianessCopy(&float64, buf, size);
            if (data_format == DataFormat_Dec) { ImSnprintf(out_buf, out_buf_size, "%f", float64); return; }
            if (data_format == DataFormat_Hex) { ImSnprintf(out_buf, out_buf_size, "%a", float64); return; }
            break;
        }
        case ImGuiDataType_COUNT:
            break;
        } // Switch
        IM_ASSERT(0); // Shouldn't reach
    }